

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r6p_2lin.cpp
# Opt level: O2

int R6P2Lin(MatrixXd *X,MatrixXd *u,int direction,double r0,RSDoublelinCameraPoseVector *results)

{
  Scalar *s;
  CommaInitializer<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_> *pCVar1;
  CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *pCVar2;
  long lVar3;
  long lVar4;
  double *pdVar5;
  int i;
  ulong uVar6;
  long lVar7;
  double dVar8;
  double dVar9;
  double c;
  double r;
  double local_380;
  double local_378;
  undefined8 uStack_370;
  double local_368;
  ulong uStack_360;
  double local_358;
  ulong uStack_350;
  double local_340;
  double local_338;
  VectorXd Ct;
  double local_320;
  double local_318;
  double local_310;
  undefined1 local_308 [16];
  double local_2f8;
  ulong uStack_2f0;
  VectorXd p;
  VectorXd x;
  vector<double,_std::allocator<double>_> w3;
  vector<double,_std::allocator<double>_> w2;
  vector<double,_std::allocator<double>_> w1;
  vector<double,_std::allocator<double>_> v3;
  vector<double,_std::allocator<double>_> v2;
  vector<double,_std::allocator<double>_> v1;
  MatrixXd H;
  MatrixXd Helimtr;
  list<int,_std::allocator<int>_> b;
  CommaInitializer<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_> local_1a0;
  undefined8 local_180;
  Index local_170;
  MatrixXd Helim;
  undefined1 local_148 [24];
  PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *local_130;
  variable_if_dynamic<long,__1> local_128;
  variable_if_dynamic<long,__1> local_120;
  double local_118;
  double local_110;
  double local_108;
  PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> local_100 [24];
  double local_e8;
  double dStack_e0;
  MatrixXd g;
  MatrixXd A;
  double *local_88;
  undefined8 local_80;
  Matrix<double,__1,_1,_0,__1,_1> *local_70;
  undefined8 local_68;
  Index local_58;
  double local_50;
  double local_48;
  ulong uStack_40;
  
  local_148._0_4_ = 0xc;
  local_1a0.m_xpr =
       (Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false> *)
       CONCAT44(local_1a0.m_xpr._4_4_,0x16);
  local_380 = r0;
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<int,int>
            ((Matrix<double,_1,_1,0,_1,_1> *)&H,(int *)local_148,(int *)&local_1a0);
  lVar3 = 8;
  lVar7 = 1;
  for (lVar4 = 0; lVar4 != 0x60; lVar4 = lVar4 + 0x10) {
    local_128.m_value = lVar7 + -1;
    pdVar5 = (X->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_data;
    local_358 = *(double *)((long)pdVar5 + lVar3 * 2 + -0x10);
    uStack_350 = 0;
    local_368 = *(double *)((long)pdVar5 + lVar3 * 2 + -8);
    uStack_360 = 0;
    local_378 = *(double *)((long)pdVar5 + lVar3 * 2);
    uStack_370 = 0;
    pdVar5 = (u->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_data;
    r = *(double *)((long)pdVar5 + lVar4);
    c = *(double *)((long)pdVar5 + lVar4 + 8);
    if (direction == 0) {
      local_148._0_8_ =
           (long)H.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data
           + lVar4;
      local_148._16_8_ =
           H.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols;
      local_130 = (PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&H;
      local_120.m_value = 0;
      local_1a0.m_xpr = (Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false> *)local_148;
      local_1a0.m_row = 0;
      local_118 = 4.94065645841247e-324;
      local_1a0.m_col = 1;
      local_1a0.m_currentBlockRows = 1;
      *(undefined8 *)
       ((long)H.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data +
       lVar4) = 0;
      local_88 = (double *)0xbff0000000000000;
      pCVar1 = Eigen::
               CommaInitializer<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>
               ::operator_(&local_1a0,(Scalar *)&local_88);
      pCVar1 = Eigen::
               CommaInitializer<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>
               ::operator_(pCVar1,&c);
      Helim.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
           (double *)0x0;
      pCVar1 = Eigen::
               CommaInitializer<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>
               ::operator_(pCVar1,(Scalar *)&Helim);
      b.super__List_base<int,_std::allocator<int>_>._M_impl._M_node.super__List_node_base._M_next =
           (_List_node_base *)(local_380 - r);
      pCVar1 = Eigen::
               CommaInitializer<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>
               ::operator_(pCVar1,(Scalar *)&b);
      Helimtr.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
           (double *)(c * r - c * local_380);
      pCVar1 = Eigen::
               CommaInitializer<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>
               ::operator_(pCVar1,(Scalar *)&Helimtr);
      local_2f8 = local_368 * local_380;
      uStack_2f0 = uStack_360;
      g.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
           (double *)(c * local_378 * local_380 + ((local_368 * r - local_2f8) - r * c * local_378))
      ;
      pCVar1 = Eigen::
               CommaInitializer<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>
               ::operator_(pCVar1,(Scalar *)&g);
      v1.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      pCVar1 = Eigen::
               CommaInitializer<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>
               ::operator_(pCVar1,(Scalar *)&v1);
      v2.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      pCVar1 = Eigen::
               CommaInitializer<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>
               ::operator_(pCVar1,(Scalar *)&v2);
      dVar9 = -local_358;
      dVar8 = local_358 * local_380;
      v3.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)(dVar8 - r * local_358);
      pCVar1 = Eigen::
               CommaInitializer<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>
               ::operator_(pCVar1,(Scalar *)&v3);
      w1.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)(c * local_378 * local_380 - r * c * local_378);
      pCVar1 = Eigen::
               CommaInitializer<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>
               ::operator_(pCVar1,(Scalar *)&w1);
      local_308._8_4_ = (int)uStack_370;
      local_308._0_8_ = -local_378;
      local_308._12_4_ = (uint)((ulong)uStack_370 >> 0x20) ^ 0x80000000;
      w2.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)(local_378 * local_380 - r * local_378);
      pCVar1 = Eigen::
               CommaInitializer<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>
               ::operator_(pCVar1,(Scalar *)&w2);
      w3.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)(c * local_358 * r - c * local_358 * local_380);
      pCVar1 = Eigen::
               CommaInitializer<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>
               ::operator_(pCVar1,(Scalar *)&w3);
      A.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
           (double *)(c * local_368 * r - c * local_368 * local_380);
      pCVar1 = Eigen::
               CommaInitializer<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>
               ::operator_(pCVar1,(Scalar *)&A);
      p.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
           (double *)(r * local_368 - local_2f8);
      pCVar1 = Eigen::
               CommaInitializer<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>
               ::operator_(pCVar1,(Scalar *)&p);
      x.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
           (double *)(c * local_368 + local_378);
      pCVar1 = Eigen::
               CommaInitializer<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>
               ::operator_(pCVar1,(Scalar *)&x);
      Ct.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
           (double *)(c * dVar9);
      pCVar1 = Eigen::
               CommaInitializer<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>
               ::operator_(pCVar1,(Scalar *)&Ct);
      local_338 = dVar9;
      pCVar1 = Eigen::
               CommaInitializer<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>
               ::operator_(pCVar1,&local_338);
      local_308._0_8_ = (double)local_308._0_8_ * local_380;
      local_310 = (r * c * local_368 + local_378 * r + (double)local_308._0_8_) -
                  c * local_368 * local_380;
      pCVar1 = Eigen::
               CommaInitializer<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>
               ::operator_(pCVar1,&local_310);
      local_318 = c * local_358 * local_380 - r * c * local_358;
      pCVar1 = Eigen::
               CommaInitializer<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>
               ::operator_(pCVar1,&local_318);
      local_340 = dVar8 - r * local_358;
      pCVar1 = Eigen::
               CommaInitializer<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>
               ::operator_(pCVar1,&local_340);
      dVar9 = -local_368;
      local_320 = c * local_378 - local_368;
      Eigen::CommaInitializer<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>
      ::operator_(pCVar1,&local_320);
      local_148._0_8_ =
           (long)H.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data
           + lVar4 + 8;
      local_148._16_8_ =
           H.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols;
      local_130 = (PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&H;
      local_120.m_value = 0;
      local_1a0.m_xpr = (Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false> *)local_148;
      local_1a0.m_row = 0;
      local_118 = 4.94065645841247e-324;
      local_1a0.m_col = 1;
      local_1a0.m_currentBlockRows = 1;
      *(double *)local_148._0_8_ = 1.0;
      local_88 = (double *)0x0;
      local_128.m_value = lVar7;
      pCVar1 = Eigen::
               CommaInitializer<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>
               ::operator_(&local_1a0,(Scalar *)&local_88);
      Helim.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
           (double *)((ulong)r ^ 0x8000000000000000);
      pCVar1 = Eigen::
               CommaInitializer<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>
               ::operator_(pCVar1,(Scalar *)&Helim);
      b.super__List_base<int,_std::allocator<int>_>._M_impl._M_node.super__List_node_base._M_next =
           (_List_node_base *)(r - local_380);
      pCVar1 = Eigen::
               CommaInitializer<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>
               ::operator_(pCVar1,(Scalar *)&b);
      Helimtr.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
           (double *)0x0;
      pCVar1 = Eigen::
               CommaInitializer<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>
               ::operator_(pCVar1,(Scalar *)&Helimtr);
      g.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
           (double *)(r * local_380 - r * r);
      pCVar1 = Eigen::
               CommaInitializer<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>
               ::operator_(pCVar1,(Scalar *)&g);
      v1.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)(local_378 * r * r + (double)local_308._0_8_ * r);
      pCVar1 = Eigen::
               CommaInitializer<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>
               ::operator_(pCVar1,(Scalar *)&v1);
      v2.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)(r * local_368 - local_2f8);
      pCVar1 = Eigen::
               CommaInitializer<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>
               ::operator_(pCVar1,(Scalar *)&v2);
      v3.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)(r * local_378 + (double)local_308._0_8_);
      pCVar1 = Eigen::
               CommaInitializer<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>
               ::operator_(pCVar1,(Scalar *)&v3);
      w1.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      pCVar1 = Eigen::
               CommaInitializer<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>
               ::operator_(pCVar1,(Scalar *)&w1);
      w2.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)((r * local_378 * r + (dVar8 - r * local_358)) - local_378 * r * local_380
                          );
      pCVar1 = Eigen::
               CommaInitializer<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>
               ::operator_(pCVar1,(Scalar *)&w2);
      w3.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      pCVar1 = Eigen::
               CommaInitializer<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>
               ::operator_(pCVar1,(Scalar *)&w3);
      A.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
           (double *)(dVar8 * r - r * local_358 * r);
      pCVar1 = Eigen::
               CommaInitializer<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>
               ::operator_(pCVar1,(Scalar *)&A);
      p.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
           (double *)(local_2f8 * r - r * local_368 * r);
      pCVar1 = Eigen::
               CommaInitializer<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>
               ::operator_(pCVar1,(Scalar *)&p);
      x.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
           (double *)(dVar8 - r * local_358);
      pCVar1 = Eigen::
               CommaInitializer<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>
               ::operator_(pCVar1,(Scalar *)&x);
      Ct.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
           (double *)(r * dVar9);
      pCVar1 = Eigen::
               CommaInitializer<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>
               ::operator_(pCVar1,(Scalar *)&Ct);
      local_338 = r * local_358 + local_378;
      pCVar1 = Eigen::
               CommaInitializer<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>
               ::operator_(pCVar1,&local_338);
      local_310 = dVar9;
      pCVar1 = Eigen::
               CommaInitializer<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>
               ::operator_(pCVar1,&local_310);
      local_318 = local_2f8 * r - r * local_368 * r;
      pCVar1 = Eigen::
               CommaInitializer<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>
               ::operator_(pCVar1,&local_318);
      local_340 = (r * local_358 * r + local_378 * r + (double)local_308._0_8_) -
                  local_358 * r * local_380;
      pCVar1 = Eigen::
               CommaInitializer<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>
               ::operator_(pCVar1,&local_340);
      local_320 = local_2f8 - local_368 * r;
      pCVar1 = Eigen::
               CommaInitializer<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>
               ::operator_(pCVar1,&local_320);
      local_50 = local_358 - local_378 * r;
      pdVar5 = &local_50;
    }
    else {
      local_148._0_8_ =
           (long)H.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data
           + lVar4;
      local_148._16_8_ =
           H.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols;
      local_130 = (PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&H;
      local_120.m_value = 0;
      local_1a0.m_xpr = (Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false> *)local_148;
      local_1a0.m_row = 0;
      local_118 = 4.94065645841247e-324;
      local_1a0.m_col = 1;
      local_1a0.m_currentBlockRows = 1;
      *(undefined8 *)
       ((long)H.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data +
       lVar4) = 0;
      local_88 = (double *)0xbff0000000000000;
      pCVar1 = Eigen::
               CommaInitializer<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>
               ::operator_(&local_1a0,(Scalar *)&local_88);
      pCVar1 = Eigen::
               CommaInitializer<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>
               ::operator_(pCVar1,&c);
      Helim.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
           (double *)0x0;
      pCVar1 = Eigen::
               CommaInitializer<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>
               ::operator_(pCVar1,(Scalar *)&Helim);
      b.super__List_base<int,_std::allocator<int>_>._M_impl._M_node.super__List_node_base._M_next =
           (_List_node_base *)(local_380 - c);
      pCVar1 = Eigen::
               CommaInitializer<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>
               ::operator_(pCVar1,(Scalar *)&b);
      Helimtr.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
           (double *)(c * c - c * local_380);
      pCVar1 = Eigen::
               CommaInitializer<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>
               ::operator_(pCVar1,(Scalar *)&Helimtr);
      dVar8 = local_368 * local_380;
      g.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
           (double *)(local_378 * c * local_380 + ((local_368 * c - dVar8) - c * local_378 * c));
      pCVar1 = Eigen::
               CommaInitializer<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>
               ::operator_(pCVar1,(Scalar *)&g);
      v1.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      pCVar1 = Eigen::
               CommaInitializer<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>
               ::operator_(pCVar1,(Scalar *)&v1);
      v2.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      pCVar1 = Eigen::
               CommaInitializer<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>
               ::operator_(pCVar1,(Scalar *)&v2);
      local_48 = -local_358;
      uStack_40 = uStack_350 ^ 0x8000000000000000;
      local_2f8 = local_358 * local_380;
      uStack_2f0 = uStack_350;
      v3.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)(local_2f8 - c * local_358);
      pCVar1 = Eigen::
               CommaInitializer<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>
               ::operator_(pCVar1,(Scalar *)&v3);
      dVar9 = -local_378;
      local_308._8_8_ = uStack_370;
      local_308._0_8_ = local_378 * local_380;
      w1.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)(local_378 * local_380 * c - c * local_378 * c);
      pCVar1 = Eigen::
               CommaInitializer<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>
               ::operator_(pCVar1,(Scalar *)&w1);
      w2.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)((double)local_308._0_8_ - c * local_378);
      pCVar1 = Eigen::
               CommaInitializer<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>
               ::operator_(pCVar1,(Scalar *)&w2);
      w3.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)(local_358 * c * c - c * local_2f8);
      pCVar1 = Eigen::
               CommaInitializer<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>
               ::operator_(pCVar1,(Scalar *)&w3);
      A.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
           (double *)(local_368 * c * c - c * dVar8);
      pCVar1 = Eigen::
               CommaInitializer<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>
               ::operator_(pCVar1,(Scalar *)&A);
      p.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
           (double *)(c * local_368 - dVar8);
      pCVar1 = Eigen::
               CommaInitializer<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>
               ::operator_(pCVar1,(Scalar *)&p);
      x.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
           (double *)(c * local_368 + local_378);
      pCVar1 = Eigen::
               CommaInitializer<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>
               ::operator_(pCVar1,(Scalar *)&x);
      Ct.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
           (double *)(c * local_48);
      pCVar1 = Eigen::
               CommaInitializer<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>
               ::operator_(pCVar1,(Scalar *)&Ct);
      local_338 = local_48;
      pCVar1 = Eigen::
               CommaInitializer<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>
               ::operator_(pCVar1,&local_338);
      local_310 = (c * local_368 * c + (local_378 * c - (double)local_308._0_8_)) -
                  local_368 * c * local_380;
      pCVar1 = Eigen::
               CommaInitializer<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>
               ::operator_(pCVar1,&local_310);
      local_318 = local_2f8 * c - c * local_358 * c;
      pCVar1 = Eigen::
               CommaInitializer<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>
               ::operator_(pCVar1,&local_318);
      local_340 = local_2f8 - c * local_358;
      pCVar1 = Eigen::
               CommaInitializer<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>
               ::operator_(pCVar1,&local_340);
      local_320 = c * local_378 - local_368;
      Eigen::CommaInitializer<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>
      ::operator_(pCVar1,&local_320);
      local_148._0_8_ =
           (long)H.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data
           + lVar4 + 8;
      local_148._16_8_ =
           H.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols;
      local_130 = (PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&H;
      local_120.m_value = 0;
      local_118 = 4.94065645841247e-324;
      local_1a0.m_xpr = (Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false> *)local_148;
      local_1a0.m_row = 0;
      local_1a0.m_col = 1;
      local_1a0.m_currentBlockRows = 1;
      *(double *)local_148._0_8_ = -c;
      local_128.m_value = lVar7;
      pCVar1 = Eigen::
               CommaInitializer<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>
               ::operator_(&local_1a0,&r);
      local_88 = (double *)0x0;
      pCVar1 = Eigen::
               CommaInitializer<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>
               ::operator_(pCVar1,(Scalar *)&local_88);
      Helim.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
           (double *)(c * local_380 - c * c);
      pCVar1 = Eigen::
               CommaInitializer<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>
               ::operator_(pCVar1,(Scalar *)&Helim);
      b.super__List_base<int,_std::allocator<int>_>._M_impl._M_node.super__List_node_base._M_next =
           (_List_node_base *)(r * c - r * local_380);
      pCVar1 = Eigen::
               CommaInitializer<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>
               ::operator_(pCVar1,(Scalar *)&b);
      Helimtr.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
           (double *)0x0;
      pCVar1 = Eigen::
               CommaInitializer<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>
               ::operator_(pCVar1,(Scalar *)&Helimtr);
      g.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
           (double *)(r * dVar8 - c * local_368 * r);
      pCVar1 = Eigen::
               CommaInitializer<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>
               ::operator_(pCVar1,(Scalar *)&g);
      v1.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)(dVar8 * c - c * local_368 * c);
      pCVar1 = Eigen::
               CommaInitializer<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>
               ::operator_(pCVar1,(Scalar *)&v1);
      v2.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)((double)local_308._0_8_ * c - c * local_378 * c);
      pCVar1 = Eigen::
               CommaInitializer<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>
               ::operator_(pCVar1,(Scalar *)&v2);
      v3.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)(c * local_358 * r - r * local_2f8);
      pCVar1 = Eigen::
               CommaInitializer<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>
               ::operator_(pCVar1,(Scalar *)&v3);
      w1.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)(local_358 * c * c - c * local_2f8);
      pCVar1 = Eigen::
               CommaInitializer<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>
               ::operator_(pCVar1,(Scalar *)&w1);
      w2.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)(c * local_378 * r - r * (double)local_308._0_8_);
      pCVar1 = Eigen::
               CommaInitializer<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>
               ::operator_(pCVar1,(Scalar *)&w2);
      w3.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      pCVar1 = Eigen::
               CommaInitializer<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>
               ::operator_(pCVar1,(Scalar *)&w3);
      A.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
           (double *)0x0;
      pCVar1 = Eigen::
               CommaInitializer<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>
               ::operator_(pCVar1,(Scalar *)&A);
      p.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
           (double *)
           (dVar8 * r + ((local_358 * c * c - local_358 * c * local_380) - c * local_368 * r));
      pCVar1 = Eigen::
               CommaInitializer<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>
               ::operator_(pCVar1,(Scalar *)&p);
      x.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
           (double *)(r * dVar9);
      pCVar1 = Eigen::
               CommaInitializer<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>
               ::operator_(pCVar1,(Scalar *)&x);
      Ct.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
           (double *)(dVar9 * c);
      pCVar1 = Eigen::
               CommaInitializer<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>
               ::operator_(pCVar1,(Scalar *)&Ct);
      local_338 = c * local_368 + r * local_358;
      pCVar1 = Eigen::
               CommaInitializer<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>
               ::operator_(pCVar1,&local_338);
      local_310 = r * (double)local_308._0_8_ - c * local_378 * r;
      pCVar1 = Eigen::
               CommaInitializer<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>
               ::operator_(pCVar1,&local_310);
      local_318 = (double)local_308._0_8_ * c - local_378 * c * c;
      pCVar1 = Eigen::
               CommaInitializer<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>
               ::operator_(pCVar1,&local_318);
      local_340 = (c * local_358 * r + (local_368 * c * c - local_368 * c * local_380)) -
                  local_2f8 * r;
      pCVar1 = Eigen::
               CommaInitializer<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>
               ::operator_(pCVar1,&local_340);
      local_320 = local_368 * r - local_358 * c;
      pdVar5 = &local_320;
    }
    Eigen::CommaInitializer<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>::
    operator_(pCVar1,pdVar5);
    lVar3 = lVar3 + 0xc;
    lVar7 = lVar7 + 2;
  }
  local_148._0_8_ = &H;
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  PlainObjectBase<Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&Helim,
             (DenseBase<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_> *)local_148);
  b.super__List_base<int,_std::allocator<int>_>._M_impl._M_node.super__List_node_base._M_next =
       (_List_node_base *)&b;
  b.super__List_base<int,_std::allocator<int>_>._M_impl._M_node._M_size = 0;
  b.super__List_base<int,_std::allocator<int>_>._M_impl._M_node.super__List_node_base._M_prev =
       b.super__List_base<int,_std::allocator<int>_>._M_impl._M_node.super__List_node_base._M_next;
  colEchelonForm(&Helim,(list<int,_std::allocator<int>_> *)
                        b.super__List_base<int,_std::allocator<int>_>._M_impl._M_node.
                        super__List_node_base._M_next);
  local_148._0_8_ = &Helim;
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  PlainObjectBase<Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&Helimtr,
             (DenseBase<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_> *)local_148);
  g.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols = 0;
  g.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       (double *)0x0;
  g.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows = 0;
  p.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data = (double *)0x0;
  p.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
  v1.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  v1.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  v1.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  v2.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  v2.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  v2.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  v3.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  v3.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  v3.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  w1.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  w1.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  w1.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  w2.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  w2.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  w2.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  w3.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  w3.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  w3.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_148._0_8_ =
       Helimtr.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data +
       Helimtr.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows *
       0xc + 6;
  local_148._8_8_ = 6;
  local_148._16_8_ = 10;
  local_128.m_value = 6;
  local_120.m_value = 0xc;
  local_118 = (double)Helimtr.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                      m_storage.m_rows;
  local_130 = (PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&Helimtr;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false>>>
            (&g,(Transpose<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>_> *
                )local_148);
  local_148._0_8_ =
       g.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data;
  local_148._8_8_ = 0x3c;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Map<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>>
            (&p,(Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> *)local_148);
  solveVW3var(p.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data,&v1,
              &v2,&v3,&w1,&w2,&w3);
  local_148._0_4_ = 0x10;
  local_1a0.m_xpr =
       (Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false> *)
       CONCAT44(local_1a0.m_xpr._4_4_,1);
  Eigen::Matrix<double,-1,1,0,-1,1>::Matrix<int,int>
            ((Matrix<double,_1,1,0,_1,1> *)&x,(int *)local_148,(int *)&local_1a0);
  local_148._0_8_ =
       Helimtr.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data +
       Helimtr.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows * 6
  ;
  local_148._8_8_ = 2.96439387504748e-323;
  local_148._16_8_ = 7.90505033345994e-323;
  local_128.m_value = 0;
  local_120.m_value = 6;
  local_118 = (double)Helimtr.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                      m_storage.m_rows;
  local_130 = (PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&Helimtr;
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  PlainObjectBase<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&A,
             (DenseBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>_> *)
             local_148);
  local_148._0_4_ = 6;
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>(&Ct,(int *)local_148);
  for (uVar6 = 0;
      uVar6 < (ulong)((long)v1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)v1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start >> 3); uVar6 = uVar6 + 1) {
    s = v1.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_start + uVar6;
    *x.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
         *s * w1.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
              ._M_start[uVar6];
    x.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data[1] =
         *s * w2.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
              ._M_start[uVar6];
    x.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data[2] =
         *s * w3.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
              ._M_start[uVar6];
    x.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data[3] =
         v2.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
         _M_start[uVar6] *
         w1.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
         _M_start[uVar6];
    x.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data[4] =
         v2.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
         _M_start[uVar6] *
         w2.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
         _M_start[uVar6];
    x.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data[5] =
         v2.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
         _M_start[uVar6] *
         w3.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
         _M_start[uVar6];
    x.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data[6] =
         v3.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
         _M_start[uVar6] *
         w1.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
         _M_start[uVar6];
    x.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data[7] =
         v3.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
         _M_start[uVar6] *
         w2.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
         _M_start[uVar6];
    local_148._8_8_ = 8;
    local_130 = (PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)0x1;
    local_148._16_8_ = 1;
    x.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data[8] =
         v3.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
         _M_start[uVar6] *
         w3.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
         _M_start[uVar6];
    local_148._0_8_ = &x;
    pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                       ((CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_148,s);
    pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                       (pCVar2,v2.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_start + uVar6);
    pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                       (pCVar2,v3.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_start + uVar6);
    pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                       (pCVar2,w1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_start + uVar6);
    pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                       (pCVar2,w2.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_start + uVar6);
    pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                       (pCVar2,w3.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_start + uVar6);
    local_1a0.m_xpr =
         (Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false> *)0x3ff0000000000000;
    Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
              (pCVar2,(Scalar *)&local_1a0);
    local_148._0_8_ = &A;
    local_148._16_8_ = &x;
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const>,Eigen::Matrix<double,_1,1,0,_1,1>,0>>
              (&Ct,(Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>
                    *)local_148);
    local_148._0_8_ =
         v1.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
         _M_start[uVar6];
    local_148._8_8_ =
         v2.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
         _M_start[uVar6];
    local_148._16_8_ =
         v3.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
         _M_start[uVar6];
    local_368 = w1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[uVar6];
    local_378 = w2.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[uVar6];
    local_380 = w3.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[uVar6];
    local_1a0.m_xpr =
         (Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false> *)
         Ct.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
    local_1a0.m_row = 3;
    local_180 = 0;
    local_170 = Ct.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
    local_1a0.m_currentBlockRows = (Index)&Ct;
    Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
    _set_noalias<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>>
              ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&local_130,
               (DenseBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_> *)
               &local_1a0);
    local_118 = local_368;
    local_110 = local_378;
    local_108 = local_380;
    local_88 = Ct.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data +
               3;
    local_80 = 3;
    local_68 = 3;
    local_58 = Ct.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
    local_70 = &Ct;
    Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
    _set_noalias<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>>
              (local_100,
               (DenseBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_> *)
               &local_88);
    local_e8 = 1.0;
    dStack_e0 = 0.0;
    std::vector<RSDoublelinCameraPose,_std::allocator<RSDoublelinCameraPose>_>::
    emplace_back<RSDoublelinCameraPose>(results,(RSDoublelinCameraPose *)local_148);
  }
  free(Ct.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  free(A.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data);
  free(x.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&w3.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&w2.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&w1.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&v3.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&v2.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&v1.super__Vector_base<double,_std::allocator<double>_>);
  free(p.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  free(g.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data);
  free(Helimtr.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data);
  std::__cxx11::_List_base<int,_std::allocator<int>_>::_M_clear
            (&b.super__List_base<int,_std::allocator<int>_>);
  free(Helim.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data);
  free(H.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data);
  return 0;
}

Assistant:

int R6P2Lin(const Eigen::MatrixXd & X, const Eigen::MatrixXd & u, int direction, double r0, RSDoublelinCameraPoseVector * results){
	Eigen::MatrixXd H(12, 22);
	double X_1, X_2, X_3, r, c, c0;
	bool planar = false;
	if (direction!=0){
		c0 = r0;
	}
	

	for (int i = 0; i < 6; i++)
	{
		X_1 = X(i * 3);
		X_2 = X(i * 3 + 1);
		X_3 = X(i * 3 + 2);
		r = u(i * 2);
		c = u(i * 2 + 1);

		if (direction == 0){
			H.row(i * 2) << 0, -1, c, 0, r0 - r, c*r - c*r0, X_2*r - X_2*r0 - X_3*c*r + X_3*c*r0, 0, 0, X_1*r0 - X_1*r, X_3*c*r0 - X_3*c*r, X_3*r0 - X_3*r, X_1*c*r - X_1*c*r0, X_2*c*r - X_2*c*r0, X_2*r - X_2*r0, X_3 + X_2*c, -X_1*c, -X_1, X_3*r - X_3*r0 + X_2*c*r - X_2*c*r0, X_1*c*r0 - X_1*c*r, X_1*r0 - X_1*r, X_3*c - X_2;
			H.row(i * 2 + 1) << 1, 0, -r, r - r0, 0, -r*r + r0*r, X_3*r*r - X_3*r0*r, X_2*r - X_2*r0, X_3*r - X_3*r0, 0, X_1*r0 - X_1*r + X_3*r*r - X_3*r*r0, 0, -X_1*r*r + X_1*r0*r, -X_2*r*r + X_2*r0*r, X_1*r0 - X_1*r, -X_2*r, X_3 + X_1*r, -X_2, -X_2*r*r + X_2*r0*r, X_3*r - X_3*r0 + X_1*r*r - X_1*r*r0, X_2*r0 - X_2*r, X_1 - X_3*r;
		}
		else{
			H.row(i * 2) << 0, -1, c, 0, c0 - c, c*c - c0*c, X_2*c - X_2*c0 - X_3*c*c + X_3*c*c0, 0, 0, X_1*c0 - X_1*c, -X_3*c*c + X_3*c0*c, X_3*c0 - X_3*c, X_1*c*c - X_1*c0*c, X_2*c*c - X_2*c0*c, X_2*c - X_2*c0, X_3 + X_2*c, -X_1*c, -X_1, X_3*c - X_3*c0 + X_2*c*c - X_2*c*c0, -X_1*c*c + X_1*c0*c, X_1*c0 - X_1*c, X_3*c - X_2;
			H.row(i * 2 + 1) << -c, r, 0, -c*c + c0*c, c*r - c0*r, 0, X_2*c0*r - X_2*c*r, -X_2*c*c + X_2*c0*c, -X_3*c*c+ X_3*c0*c, X_1*c*r - X_1*c0*r, X_1*c*c - X_1*c0*c, X_3*c*r - X_3*c0*r, 0, 0, X_1*c*c - X_1*c*c0 - X_2*c*r + X_2*c0*r, -X_3*r, -X_3*c, X_2*c + X_1*r, X_3*c0*r - X_3*c*r, -X_3*c*c + X_3*c0*c, X_2*c*c - X_2*c*c0 + X_1*c*r - X_1*c0*r, X_2*r - X_1*c;
		}
	}
	
	Eigen::MatrixXd Helim = H.transpose();
	std::list<int> b;
	colEchelonForm(Helim, b);

	Eigen::MatrixXd Helimtr = Helim.transpose();
	
	Eigen::MatrixXd g; 
	Eigen::VectorXd p;
	std::vector<double> v1, v2, v3, w1, w2, w3;
	
    g = Helimtr.block(6, 12, 6, 10).transpose();
    p = Eigen::Map<Eigen::VectorXd>(g.data(), 6 * 10);
    solveVW3var(p.data(), v1, v2, v3, w1, w2, w3);
	
	Eigen::VectorXd x(16,1);
	Eigen::MatrixXd A = Helimtr.block(0,6,6,16);
	Eigen::VectorXd Ct(6);
	Eigen::Vector3d Cres;

	for (int i = 0; i < v1.size(); i++)
	{
		x << v1[i]*w1[i], v1[i]*w2[i], v1[i]*w3[i], v2[i]*w1[i], v2[i]*w2[i], v2[i]*w3[i], v3[i]*w1[i], v3[i]*w2[i], v3[i]*w3[i], v1[i], v2[i], v3[i], w1[i], w2[i], w3[i], 1;
		Ct = -A*x;
		Eigen::Vector3d vr, wr;
		vr << v1[i], v2[i], v3[i];
		wr << w1[i], w2[i], w3[i];
		results->push_back({vr, Ct.segment(0, 3), wr, Ct.segment(3, 3), 1, 0});
	}

    return 0;
}